

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  byte bVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  AABBNodeMB4D *node1;
  ulong uVar114;
  long lVar115;
  int iVar116;
  ulong uVar117;
  long lVar118;
  uint uVar119;
  ulong uVar120;
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  long lVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar142;
  float fVar143;
  undefined1 auVar141 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  float fVar156;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar182;
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  undefined1 auVar186 [32];
  uint uVar188;
  uint uVar189;
  uint uVar190;
  uint uVar191;
  uint uVar192;
  uint uVar193;
  uint uVar194;
  undefined1 auVar187 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  float fVar198;
  undefined1 auVar199 [16];
  float fVar204;
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1754;
  Scene *local_1750;
  long local_1748;
  undefined1 local_1740 [8];
  float fStack_1738;
  float fStack_1734;
  undefined1 local_1730 [8];
  float fStack_1728;
  float fStack_1724;
  ulong local_1720;
  ulong local_1718;
  ulong *local_1710;
  long local_1708;
  ulong local_1700;
  ulong local_16f8;
  long local_16f0;
  ulong local_16e8;
  ulong local_16e0;
  ulong local_16d8;
  ulong local_16d0;
  ulong local_16c8;
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  float local_1680;
  float local_167c;
  float local_1678;
  float local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  uint local_1668;
  uint local_1664;
  uint local_1660;
  RTCFilterFunctionNArguments local_1650;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [8];
  float fStack_15b8;
  float fStack_15b4;
  undefined1 local_15b0 [8];
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  undefined1 local_1590 [8];
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  undefined1 local_1570 [8];
  float fStack_1568;
  float fStack_1564;
  undefined1 local_1560 [8];
  float fStack_1558;
  float fStack_1554;
  undefined1 local_1550 [8];
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  undefined1 local_1530 [16];
  undefined1 local_1520 [32];
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  undefined1 auVar152 [64];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar156 = ray->tfar;
    auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar156) {
      local_1710 = local_11f8;
      auVar132 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar131._8_4_ = 0x7fffffff;
      auVar131._0_8_ = 0x7fffffff7fffffff;
      auVar131._12_4_ = 0x7fffffff;
      auVar131 = vandps_avx((undefined1  [16])aVar5,auVar131);
      auVar157._8_4_ = 0x219392ef;
      auVar157._0_8_ = 0x219392ef219392ef;
      auVar157._12_4_ = 0x219392ef;
      auVar131 = vcmpps_avx(auVar131,auVar157,1);
      auVar131 = vblendvps_avx((undefined1  [16])aVar5,auVar157,auVar131);
      auVar157 = vrcpps_avx(auVar131);
      fVar163 = auVar157._0_4_;
      auVar144._0_4_ = fVar163 * auVar131._0_4_;
      fVar164 = auVar157._4_4_;
      auVar144._4_4_ = fVar164 * auVar131._4_4_;
      fVar165 = auVar157._8_4_;
      auVar144._8_4_ = fVar165 * auVar131._8_4_;
      fVar166 = auVar157._12_4_;
      auVar144._12_4_ = fVar166 * auVar131._12_4_;
      auVar158._8_4_ = 0x3f800000;
      auVar158._0_8_ = 0x3f8000003f800000;
      auVar158._12_4_ = 0x3f800000;
      auVar131 = vsubps_avx(auVar158,auVar144);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_13e0._4_4_ = uVar3;
      local_13e0._0_4_ = uVar3;
      local_13e0._8_4_ = uVar3;
      local_13e0._12_4_ = uVar3;
      local_13e0._16_4_ = uVar3;
      local_13e0._20_4_ = uVar3;
      local_13e0._24_4_ = uVar3;
      local_13e0._28_4_ = uVar3;
      auVar172 = ZEXT3264(local_13e0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1400._4_4_ = uVar3;
      local_1400._0_4_ = uVar3;
      local_1400._8_4_ = uVar3;
      local_1400._12_4_ = uVar3;
      local_1400._16_4_ = uVar3;
      local_1400._20_4_ = uVar3;
      local_1400._24_4_ = uVar3;
      local_1400._28_4_ = uVar3;
      auVar174 = ZEXT3264(local_1400);
      auVar145._0_4_ = fVar163 + fVar163 * auVar131._0_4_;
      auVar145._4_4_ = fVar164 + fVar164 * auVar131._4_4_;
      auVar145._8_4_ = fVar165 + fVar165 * auVar131._8_4_;
      auVar145._12_4_ = fVar166 + fVar166 * auVar131._12_4_;
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1420._4_4_ = uVar3;
      local_1420._0_4_ = uVar3;
      local_1420._8_4_ = uVar3;
      local_1420._12_4_ = uVar3;
      local_1420._16_4_ = uVar3;
      local_1420._20_4_ = uVar3;
      local_1420._24_4_ = uVar3;
      local_1420._28_4_ = uVar3;
      auVar179 = ZEXT3264(local_1420);
      auVar131 = vshufps_avx(auVar145,auVar145,0);
      local_1440._16_16_ = auVar131;
      local_1440._0_16_ = auVar131;
      auVar187 = ZEXT3264(local_1440);
      auVar131 = vmovshdup_avx(auVar145);
      auVar155 = ZEXT1664(auVar131);
      auVar157 = vshufps_avx(auVar145,auVar145,0x55);
      local_1460._16_16_ = auVar157;
      local_1460._0_16_ = auVar157;
      auVar196 = ZEXT3264(local_1460);
      auVar157 = vshufpd_avx(auVar145,auVar145,1);
      auVar161 = ZEXT1664(auVar157);
      auVar144 = vshufps_avx(auVar145,auVar145,0xaa);
      uVar126 = (ulong)(auVar145._0_4_ < 0.0) << 5;
      uVar129 = (ulong)(auVar131._0_4_ < 0.0) << 5 | 0x40;
      local_1480._16_16_ = auVar144;
      local_1480._0_16_ = auVar144;
      auVar197 = ZEXT3264(local_1480);
      uVar130 = (ulong)(auVar157._0_4_ < 0.0) << 5 | 0x80;
      auVar131 = vshufps_avx(auVar132,auVar132,0);
      local_14a0._16_16_ = auVar131;
      local_14a0._0_16_ = auVar131;
      auVar201 = ZEXT3264(local_14a0);
      auVar131 = vshufps_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),0);
      local_1520._16_16_ = mm_lookupmask_ps._240_16_;
      local_1520._0_16_ = mm_lookupmask_ps._240_16_;
      local_14c0._16_16_ = auVar131;
      local_14c0._0_16_ = auVar131;
      auVar209 = ZEXT3264(local_14c0);
      local_14e0 = vperm2f128_avx(local_1520,mm_lookupmask_ps._0_32_,2);
      auVar141 = ZEXT3264(local_14e0);
      auVar133._8_4_ = 0xbf800000;
      auVar133._0_8_ = 0xbf800000bf800000;
      auVar133._12_4_ = 0xbf800000;
      auVar133._16_4_ = 0xbf800000;
      auVar133._20_4_ = 0xbf800000;
      auVar133._24_4_ = 0xbf800000;
      auVar133._28_4_ = 0xbf800000;
      auVar147._8_4_ = 0x3f800000;
      auVar147._0_8_ = 0x3f8000003f800000;
      auVar147._12_4_ = 0x3f800000;
      auVar147._16_4_ = 0x3f800000;
      auVar147._20_4_ = 0x3f800000;
      auVar147._24_4_ = 0x3f800000;
      auVar147._28_4_ = 0x3f800000;
      auVar152 = ZEXT3264(auVar147);
      _local_1500 = vblendvps_avx(auVar147,auVar133,local_14e0);
      local_1718 = uVar126;
      local_1720 = uVar129;
      uVar120 = uVar126;
      uVar122 = uVar129;
LAB_002ec4fb:
      do {
        uVar121 = local_1710[-1];
        local_1710 = local_1710 + -1;
        while ((uVar121 & 8) == 0) {
          uVar114 = uVar121 & 0xfffffffffffffff0;
          fVar156 = (ray->dir).field_0.m128[3];
          auVar134._4_4_ = fVar156;
          auVar134._0_4_ = fVar156;
          auVar134._8_4_ = fVar156;
          auVar134._12_4_ = fVar156;
          auVar134._16_4_ = fVar156;
          auVar134._20_4_ = fVar156;
          auVar134._24_4_ = fVar156;
          auVar134._28_4_ = fVar156;
          pfVar2 = (float *)(uVar114 + 0x100 + uVar120);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar120);
          auVar136._0_4_ = fVar156 * *pfVar2 + *pfVar1;
          auVar136._4_4_ = fVar156 * pfVar2[1] + pfVar1[1];
          auVar136._8_4_ = fVar156 * pfVar2[2] + pfVar1[2];
          auVar136._12_4_ = fVar156 * pfVar2[3] + pfVar1[3];
          auVar136._16_4_ = fVar156 * pfVar2[4] + pfVar1[4];
          auVar136._20_4_ = fVar156 * pfVar2[5] + pfVar1[5];
          auVar136._24_4_ = fVar156 * pfVar2[6] + pfVar1[6];
          auVar136._28_4_ = auVar141._28_4_ + pfVar1[7];
          auVar133 = vsubps_avx(auVar136,auVar172._0_32_);
          auVar78._4_4_ = auVar187._4_4_ * auVar133._4_4_;
          auVar78._0_4_ = auVar187._0_4_ * auVar133._0_4_;
          auVar78._8_4_ = auVar187._8_4_ * auVar133._8_4_;
          auVar78._12_4_ = auVar187._12_4_ * auVar133._12_4_;
          auVar78._16_4_ = auVar187._16_4_ * auVar133._16_4_;
          auVar78._20_4_ = auVar187._20_4_ * auVar133._20_4_;
          auVar78._24_4_ = auVar187._24_4_ * auVar133._24_4_;
          auVar78._28_4_ = auVar133._28_4_;
          auVar133 = vmaxps_avx(auVar201._0_32_,auVar78);
          pfVar2 = (float *)(uVar114 + 0x100 + uVar122);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar122);
          auVar148._0_4_ = fVar156 * *pfVar2 + *pfVar1;
          auVar148._4_4_ = fVar156 * pfVar2[1] + pfVar1[1];
          auVar148._8_4_ = fVar156 * pfVar2[2] + pfVar1[2];
          auVar148._12_4_ = fVar156 * pfVar2[3] + pfVar1[3];
          auVar148._16_4_ = fVar156 * pfVar2[4] + pfVar1[4];
          auVar148._20_4_ = fVar156 * pfVar2[5] + pfVar1[5];
          auVar148._24_4_ = fVar156 * pfVar2[6] + pfVar1[6];
          auVar148._28_4_ = auVar152._28_4_ + pfVar1[7];
          auVar147 = vsubps_avx(auVar148,auVar174._0_32_);
          auVar79._4_4_ = auVar196._4_4_ * auVar147._4_4_;
          auVar79._0_4_ = auVar196._0_4_ * auVar147._0_4_;
          auVar79._8_4_ = auVar196._8_4_ * auVar147._8_4_;
          auVar79._12_4_ = auVar196._12_4_ * auVar147._12_4_;
          auVar79._16_4_ = auVar196._16_4_ * auVar147._16_4_;
          auVar79._20_4_ = auVar196._20_4_ * auVar147._20_4_;
          auVar79._24_4_ = auVar196._24_4_ * auVar147._24_4_;
          auVar79._28_4_ = auVar147._28_4_;
          pfVar2 = (float *)(uVar114 + 0x100 + uVar130);
          pfVar1 = (float *)(uVar114 + 0x40 + uVar130);
          auVar153._0_4_ = fVar156 * *pfVar2 + *pfVar1;
          auVar153._4_4_ = fVar156 * pfVar2[1] + pfVar1[1];
          auVar153._8_4_ = fVar156 * pfVar2[2] + pfVar1[2];
          auVar153._12_4_ = fVar156 * pfVar2[3] + pfVar1[3];
          auVar153._16_4_ = fVar156 * pfVar2[4] + pfVar1[4];
          auVar153._20_4_ = fVar156 * pfVar2[5] + pfVar1[5];
          auVar153._24_4_ = fVar156 * pfVar2[6] + pfVar1[6];
          auVar153._28_4_ = auVar155._28_4_ + pfVar1[7];
          auVar78 = vsubps_avx(auVar153,auVar179._0_32_);
          auVar80._4_4_ = auVar197._4_4_ * auVar78._4_4_;
          auVar80._0_4_ = auVar197._0_4_ * auVar78._0_4_;
          auVar80._8_4_ = auVar197._8_4_ * auVar78._8_4_;
          auVar80._12_4_ = auVar197._12_4_ * auVar78._12_4_;
          auVar80._16_4_ = auVar197._16_4_ * auVar78._16_4_;
          auVar80._20_4_ = auVar197._20_4_ * auVar78._20_4_;
          auVar80._24_4_ = auVar197._24_4_ * auVar78._24_4_;
          auVar80._28_4_ = auVar78._28_4_;
          auVar147 = vmaxps_avx(auVar79,auVar80);
          auVar133 = vmaxps_avx(auVar133,auVar147);
          pfVar2 = (float *)(uVar114 + 0x100 + (uVar126 ^ 0x20));
          pfVar1 = (float *)(uVar114 + 0x40 + (uVar126 ^ 0x20));
          auVar149._0_4_ = fVar156 * *pfVar2 + *pfVar1;
          auVar149._4_4_ = fVar156 * pfVar2[1] + pfVar1[1];
          auVar149._8_4_ = fVar156 * pfVar2[2] + pfVar1[2];
          auVar149._12_4_ = fVar156 * pfVar2[3] + pfVar1[3];
          auVar149._16_4_ = fVar156 * pfVar2[4] + pfVar1[4];
          auVar149._20_4_ = fVar156 * pfVar2[5] + pfVar1[5];
          auVar149._24_4_ = fVar156 * pfVar2[6] + pfVar1[6];
          auVar149._28_4_ = auVar147._28_4_ + pfVar1[7];
          auVar147 = vsubps_avx(auVar149,auVar172._0_32_);
          auVar81._4_4_ = auVar187._4_4_ * auVar147._4_4_;
          auVar81._0_4_ = auVar187._0_4_ * auVar147._0_4_;
          auVar81._8_4_ = auVar187._8_4_ * auVar147._8_4_;
          auVar81._12_4_ = auVar187._12_4_ * auVar147._12_4_;
          auVar81._16_4_ = auVar187._16_4_ * auVar147._16_4_;
          auVar81._20_4_ = auVar187._20_4_ * auVar147._20_4_;
          auVar81._24_4_ = auVar187._24_4_ * auVar147._24_4_;
          auVar81._28_4_ = auVar147._28_4_;
          pfVar2 = (float *)(uVar114 + 0x100 + (uVar129 ^ 0x20));
          auVar147 = vminps_avx(auVar209._0_32_,auVar81);
          pfVar1 = (float *)(uVar114 + 0x40 + (uVar129 ^ 0x20));
          auVar154._0_4_ = fVar156 * *pfVar2 + *pfVar1;
          auVar154._4_4_ = fVar156 * pfVar2[1] + pfVar1[1];
          auVar154._8_4_ = fVar156 * pfVar2[2] + pfVar1[2];
          auVar154._12_4_ = fVar156 * pfVar2[3] + pfVar1[3];
          auVar154._16_4_ = fVar156 * pfVar2[4] + pfVar1[4];
          auVar154._20_4_ = fVar156 * pfVar2[5] + pfVar1[5];
          auVar154._24_4_ = fVar156 * pfVar2[6] + pfVar1[6];
          auVar154._28_4_ = auVar78._28_4_ + pfVar1[7];
          auVar78 = vsubps_avx(auVar154,auVar174._0_32_);
          pfVar2 = (float *)(uVar114 + 0x100 + (uVar130 ^ 0x20));
          pfVar1 = (float *)(uVar114 + 0x40 + (uVar130 ^ 0x20));
          auVar159._0_4_ = fVar156 * *pfVar2 + *pfVar1;
          auVar159._4_4_ = fVar156 * pfVar2[1] + pfVar1[1];
          auVar159._8_4_ = fVar156 * pfVar2[2] + pfVar1[2];
          auVar159._12_4_ = fVar156 * pfVar2[3] + pfVar1[3];
          auVar159._16_4_ = fVar156 * pfVar2[4] + pfVar1[4];
          auVar159._20_4_ = fVar156 * pfVar2[5] + pfVar1[5];
          auVar159._24_4_ = fVar156 * pfVar2[6] + pfVar1[6];
          auVar159._28_4_ = auVar161._28_4_ + pfVar1[7];
          auVar82._4_4_ = auVar196._4_4_ * auVar78._4_4_;
          auVar82._0_4_ = auVar196._0_4_ * auVar78._0_4_;
          auVar82._8_4_ = auVar196._8_4_ * auVar78._8_4_;
          auVar82._12_4_ = auVar196._12_4_ * auVar78._12_4_;
          auVar82._16_4_ = auVar196._16_4_ * auVar78._16_4_;
          auVar82._20_4_ = auVar196._20_4_ * auVar78._20_4_;
          auVar82._24_4_ = auVar196._24_4_ * auVar78._24_4_;
          auVar82._28_4_ = auVar78._28_4_;
          auVar78 = vsubps_avx(auVar159,auVar179._0_32_);
          auVar87._4_4_ = auVar197._4_4_ * auVar78._4_4_;
          auVar87._0_4_ = auVar197._0_4_ * auVar78._0_4_;
          auVar87._8_4_ = auVar197._8_4_ * auVar78._8_4_;
          auVar87._12_4_ = auVar197._12_4_ * auVar78._12_4_;
          auVar87._16_4_ = auVar197._16_4_ * auVar78._16_4_;
          auVar87._20_4_ = auVar197._20_4_ * auVar78._20_4_;
          auVar87._24_4_ = auVar197._24_4_ * auVar78._24_4_;
          auVar87._28_4_ = auVar78._28_4_;
          auVar161 = ZEXT3264(auVar87);
          auVar78 = vminps_avx(auVar82,auVar87);
          auVar155 = ZEXT3264(auVar78);
          auVar147 = vminps_avx(auVar147,auVar78);
          auVar133 = vcmpps_avx(auVar133,auVar147,2);
          auVar141 = ZEXT3264(auVar133);
          if (((uint)uVar121 & 7) == 6) {
            auVar147 = vcmpps_avx(*(undefined1 (*) [32])(uVar114 + 0x1c0),auVar134,2);
            auVar78 = vcmpps_avx(auVar134,*(undefined1 (*) [32])(uVar114 + 0x1e0),1);
            auVar78 = vandps_avx(auVar147,auVar78);
            auVar133 = vandps_avx(auVar78,auVar133);
            auVar141 = ZEXT1664(auVar133._16_16_);
            auVar131 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          }
          else {
            auVar131 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
          }
          auVar152 = ZEXT3264(auVar147);
          auVar131 = vpsllw_avx(auVar131,0xf);
          if ((((((((auVar131 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar131 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar131 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar131 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar131 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar131 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar131 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar131[0xf]) {
            if (local_1710 == &local_1200) {
              return;
            }
            goto LAB_002ec4fb;
          }
          auVar131 = vpacksswb_avx(auVar131,auVar131);
          bVar86 = SUB161(auVar131 >> 7,0) & 1 | (SUB161(auVar131 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar131 >> 0x17,0) & 1) << 2 | (SUB161(auVar131 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar131 >> 0x27,0) & 1) << 4 | (SUB161(auVar131 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar131 >> 0x37,0) & 1) << 6 | SUB161(auVar131 >> 0x3f,0) << 7;
          lVar12 = 0;
          if (bVar86 != 0) {
            for (; (bVar86 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar121 = *(ulong *)(uVar114 + lVar12 * 8);
          uVar119 = bVar86 - 1 & (uint)bVar86;
          if (uVar119 != 0) {
            *local_1710 = uVar121;
            local_1710 = local_1710 + 1;
            lVar12 = 0;
            if (uVar119 != 0) {
              for (; (uVar119 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            uVar121 = *(ulong *)(uVar114 + lVar12 * 8);
            uVar119 = uVar119 - 1 & uVar119;
            uVar117 = (ulong)uVar119;
            if (uVar119 != 0) {
              do {
                *local_1710 = uVar121;
                local_1710 = local_1710 + 1;
                lVar12 = 0;
                if (uVar117 != 0) {
                  for (; (uVar117 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                uVar121 = *(ulong *)(uVar114 + lVar12 * 8);
                uVar117 = uVar117 & uVar117 - 1;
              } while (uVar117 != 0);
            }
          }
        }
        local_1708 = (ulong)((uint)uVar121 & 0xf) - 8;
        if (local_1708 != 0) {
          uVar121 = uVar121 & 0xfffffffffffffff0;
          local_1750 = context->scene;
          local_1748 = 0;
          do {
            lVar115 = local_1748 * 0x60;
            pRVar8 = (local_1750->geometries).items;
            pGVar9 = pRVar8[*(uint *)(uVar121 + 0x40 + lVar115)].ptr;
            fVar156 = (pGVar9->time_range).lower;
            fVar156 = pGVar9->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar156) /
                      ((pGVar9->time_range).upper - fVar156));
            auVar131 = vroundss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),9);
            auVar131 = vminss_avx(auVar131,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
            auVar13 = vmaxss_avx(auVar170._0_16_,auVar131);
            iVar116 = (int)auVar13._0_4_;
            lVar127 = (long)iVar116 * 0x38;
            lVar12 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar127);
            local_16d8 = (ulong)*(uint *)(uVar121 + 4 + lVar115);
            auVar131 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar121 + lVar115) * 4);
            uVar122 = (ulong)*(uint *)(uVar121 + 0x10 + lVar115);
            auVar132 = *(undefined1 (*) [16])(lVar12 + uVar122 * 4);
            uVar114 = (ulong)*(uint *)(uVar121 + 0x20 + lVar115);
            auVar157 = *(undefined1 (*) [16])(lVar12 + uVar114 * 4);
            uVar117 = (ulong)*(uint *)(uVar121 + 0x30 + lVar115);
            auVar144 = *(undefined1 (*) [16])(lVar12 + uVar117 * 4);
            local_16f0 = *(long *)&pRVar8[*(uint *)(uVar121 + 0x44 + lVar115)].ptr[2].numPrimitives;
            lVar12 = *(long *)(local_16f0 + lVar127);
            auVar145 = *(undefined1 (*) [16])(lVar12 + local_16d8 * 4);
            local_16c8 = (ulong)*(uint *)(uVar121 + 0x14 + lVar115);
            auVar158 = *(undefined1 (*) [16])(lVar12 + local_16c8 * 4);
            uVar123 = (ulong)*(uint *)(uVar121 + 0x24 + lVar115);
            auVar199 = *(undefined1 (*) [16])(lVar12 + uVar123 * 4);
            uVar124 = (ulong)*(uint *)(uVar121 + 0x34 + lVar115);
            auVar146 = *(undefined1 (*) [16])(lVar12 + uVar124 * 4);
            lVar12 = *(long *)&pRVar8[*(uint *)(uVar121 + 0x48 + lVar115)].ptr[2].numPrimitives;
            lVar10 = *(long *)(lVar12 + lVar127);
            uVar125 = (ulong)*(uint *)(uVar121 + 8 + lVar115);
            auVar176 = *(undefined1 (*) [16])(lVar10 + uVar125 * 4);
            local_16e8 = (ulong)*(uint *)(uVar121 + 0x18 + lVar115);
            auVar212 = *(undefined1 (*) [16])(lVar10 + local_16e8 * 4);
            local_16e0 = (ulong)*(uint *)(uVar121 + 0x28 + lVar115);
            auVar210 = *(undefined1 (*) [16])(lVar10 + local_16e0 * 4);
            local_16d0 = (ulong)*(uint *)(uVar121 + 0x38 + lVar115);
            auVar6 = *(undefined1 (*) [16])(lVar10 + local_16d0 * 4);
            fVar156 = fVar156 - auVar13._0_4_;
            local_1530 = ZEXT416((uint)fVar156);
            lVar10 = *(long *)&pRVar8[*(uint *)(uVar121 + 0x4c + lVar115)].ptr[2].numPrimitives;
            lVar127 = *(long *)(lVar10 + lVar127);
            uVar120 = (ulong)*(uint *)(uVar121 + 0xc + lVar115);
            auVar13 = *(undefined1 (*) [16])(lVar127 + uVar120 * 4);
            local_1700 = (ulong)*(uint *)(uVar121 + 0x1c + lVar115);
            auVar7 = *(undefined1 (*) [16])(lVar127 + local_1700 * 4);
            auVar83 = vunpcklps_avx(auVar131,auVar176);
            auVar176 = vunpckhps_avx(auVar131,auVar176);
            auVar84 = vunpcklps_avx(auVar145,auVar13);
            auVar145 = vunpckhps_avx(auVar145,auVar13);
            uVar128 = (ulong)*(uint *)(uVar121 + 0x2c + lVar115);
            auVar131 = *(undefined1 (*) [16])(lVar127 + uVar128 * 4);
            _local_1550 = vunpcklps_avx(auVar176,auVar145);
            auVar112 = _local_1550;
            _local_1590 = vunpcklps_avx(auVar83,auVar84);
            auVar108 = _local_1590;
            _local_1570 = vunpckhps_avx(auVar83,auVar84);
            auVar110 = _local_1570;
            auVar176 = vunpcklps_avx(auVar132,auVar212);
            auVar145 = vunpckhps_avx(auVar132,auVar212);
            auVar212 = vunpcklps_avx(auVar158,auVar7);
            auVar158 = vunpckhps_avx(auVar158,auVar7);
            local_16f8 = (ulong)*(uint *)(uVar121 + 0x3c + lVar115);
            auVar132 = *(undefined1 (*) [16])(lVar127 + local_16f8 * 4);
            _local_1540 = vunpcklps_avx(auVar145,auVar158);
            auVar113 = _local_1540;
            _local_1580 = vunpcklps_avx(auVar176,auVar212);
            auVar109 = _local_1580;
            _local_1560 = vunpckhps_avx(auVar176,auVar212);
            auVar111 = _local_1560;
            auVar158 = vunpcklps_avx(auVar157,auVar210);
            auVar157 = vunpckhps_avx(auVar157,auVar210);
            auVar176 = vunpcklps_avx(auVar199,auVar131);
            auVar145 = vunpckhps_avx(auVar199,auVar131);
            lVar118 = (long)(iVar116 + 1) * 0x38;
            lVar127 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar118);
            auVar131 = *(undefined1 (*) [16])(lVar127 + (ulong)*(uint *)(uVar121 + lVar115) * 4);
            _local_1730 = vunpcklps_avx(auVar157,auVar145);
            auVar104 = _local_1730;
            _local_15c0 = vunpcklps_avx(auVar158,auVar176);
            auVar105 = _local_15c0;
            _local_15a0 = vunpckhps_avx(auVar158,auVar176);
            auVar107 = _local_15a0;
            auVar145 = vunpcklps_avx(auVar144,auVar6);
            auVar157 = vunpckhps_avx(auVar144,auVar6);
            auVar158 = vunpcklps_avx(auVar146,auVar132);
            auVar144 = vunpckhps_avx(auVar146,auVar132);
            lVar12 = *(long *)(lVar12 + lVar118);
            auVar132 = *(undefined1 (*) [16])(lVar12 + uVar125 * 4);
            _local_1740 = vunpcklps_avx(auVar157,auVar144);
            auVar103 = _local_1740;
            auVar199 = vunpcklps_avx(auVar145,auVar158);
            _local_15b0 = vunpckhps_avx(auVar145,auVar158);
            auVar106 = _local_15b0;
            lVar11 = *(long *)(local_16f0 + lVar118);
            auVar144 = vunpcklps_avx(auVar131,auVar132);
            auVar157 = vunpckhps_avx(auVar131,auVar132);
            auVar131 = *(undefined1 (*) [16])(lVar11 + local_16d8 * 4);
            lVar10 = *(long *)(lVar10 + lVar118);
            auVar132 = *(undefined1 (*) [16])(lVar10 + uVar120 * 4);
            auVar145 = vunpcklps_avx(auVar131,auVar132);
            auVar131 = vunpckhps_avx(auVar131,auVar132);
            auVar146 = vunpcklps_avx(auVar157,auVar131);
            auVar176 = vunpcklps_avx(auVar144,auVar145);
            auVar157 = vunpckhps_avx(auVar144,auVar145);
            auVar131 = *(undefined1 (*) [16])(lVar127 + uVar122 * 4);
            auVar132 = *(undefined1 (*) [16])(lVar12 + local_16e8 * 4);
            auVar145 = vunpcklps_avx(auVar131,auVar132);
            auVar144 = vunpckhps_avx(auVar131,auVar132);
            auVar131 = *(undefined1 (*) [16])(lVar11 + local_16c8 * 4);
            auVar132 = *(undefined1 (*) [16])(lVar10 + local_1700 * 4);
            auVar158 = vunpcklps_avx(auVar131,auVar132);
            auVar131 = vunpckhps_avx(auVar131,auVar132);
            auVar212 = vunpcklps_avx(auVar144,auVar131);
            auVar210 = vunpcklps_avx(auVar145,auVar158);
            auVar144 = vunpckhps_avx(auVar145,auVar158);
            auVar131 = *(undefined1 (*) [16])(lVar127 + uVar114 * 4);
            auVar132 = *(undefined1 (*) [16])(lVar12 + local_16e0 * 4);
            auVar158 = vunpcklps_avx(auVar131,auVar132);
            auVar145 = vunpckhps_avx(auVar131,auVar132);
            auVar131 = *(undefined1 (*) [16])(lVar11 + uVar123 * 4);
            auVar132 = *(undefined1 (*) [16])(lVar10 + uVar128 * 4);
            auVar6 = vunpcklps_avx(auVar131,auVar132);
            auVar131 = vunpckhps_avx(auVar131,auVar132);
            auVar13 = vunpcklps_avx(auVar145,auVar131);
            auVar7 = vunpcklps_avx(auVar158,auVar6);
            auVar145 = vunpckhps_avx(auVar158,auVar6);
            auVar131 = *(undefined1 (*) [16])(lVar127 + uVar117 * 4);
            auVar132 = *(undefined1 (*) [16])(lVar12 + local_16d0 * 4);
            auVar6 = vunpcklps_avx(auVar131,auVar132);
            auVar158 = vunpckhps_avx(auVar131,auVar132);
            auVar131 = *(undefined1 (*) [16])(lVar11 + uVar124 * 4);
            auVar132 = *(undefined1 (*) [16])(lVar10 + local_16f8 * 4);
            auVar83 = vunpcklps_avx(auVar131,auVar132);
            auVar131 = vunpckhps_avx(auVar131,auVar132);
            auVar84 = vunpcklps_avx(auVar158,auVar131);
            auVar85 = vunpcklps_avx(auVar6,auVar83);
            auVar158 = vunpckhps_avx(auVar6,auVar83);
            auVar131 = vshufps_avx(local_1530,local_1530,0);
            auVar132 = ZEXT416((uint)(1.0 - fVar156));
            auVar132 = vshufps_avx(auVar132,auVar132,0);
            fVar156 = auVar131._0_4_;
            fVar163 = auVar131._4_4_;
            fVar164 = auVar131._8_4_;
            fVar165 = auVar131._12_4_;
            fVar166 = auVar132._0_4_;
            fVar167 = auVar132._4_4_;
            fVar142 = auVar132._8_4_;
            fVar143 = auVar132._12_4_;
            auVar160._4_4_ = fVar167 * (float)local_1590._4_4_ + auVar176._4_4_ * fVar163;
            auVar160._0_4_ = fVar166 * (float)local_1590._0_4_ + auVar176._0_4_ * fVar156;
            auVar160._8_4_ = fVar142 * fStack_1588 + auVar176._8_4_ * fVar164;
            auVar160._12_4_ = fVar143 * fStack_1584 + auVar176._12_4_ * fVar165;
            auVar168._4_4_ = fVar167 * (float)local_1570._4_4_ + auVar157._4_4_ * fVar163;
            auVar168._0_4_ = fVar166 * (float)local_1570._0_4_ + auVar157._0_4_ * fVar156;
            auVar168._8_4_ = fVar142 * fStack_1568 + auVar157._8_4_ * fVar164;
            auVar168._12_4_ = fVar143 * fStack_1564 + auVar157._12_4_ * fVar165;
            auVar173._4_4_ = fVar167 * (float)local_1550._4_4_ + auVar146._4_4_ * fVar163;
            auVar173._0_4_ = fVar166 * (float)local_1550._0_4_ + auVar146._0_4_ * fVar156;
            auVar173._8_4_ = fVar142 * fStack_1548 + auVar146._8_4_ * fVar164;
            auVar173._12_4_ = fVar143 * fStack_1544 + auVar146._12_4_ * fVar165;
            auVar176._0_4_ = fVar166 * (float)local_1580._0_4_ + fVar156 * auVar210._0_4_;
            auVar176._4_4_ = fVar167 * (float)local_1580._4_4_ + fVar163 * auVar210._4_4_;
            auVar176._8_4_ = fVar142 * fStack_1578 + fVar164 * auVar210._8_4_;
            auVar176._12_4_ = fVar143 * fStack_1574 + fVar165 * auVar210._12_4_;
            auVar146._0_4_ = fVar166 * (float)local_1560._0_4_ + fVar156 * auVar144._0_4_;
            auVar146._4_4_ = fVar167 * (float)local_1560._4_4_ + fVar163 * auVar144._4_4_;
            auVar146._8_4_ = fVar142 * fStack_1558 + fVar164 * auVar144._8_4_;
            auVar146._12_4_ = fVar143 * fStack_1554 + fVar165 * auVar144._12_4_;
            auVar210._0_4_ = fVar166 * (float)local_1540._0_4_ + auVar212._0_4_ * fVar156;
            auVar210._4_4_ = fVar167 * (float)local_1540._4_4_ + auVar212._4_4_ * fVar163;
            auVar210._8_4_ = fVar142 * fStack_1538 + auVar212._8_4_ * fVar164;
            auVar210._12_4_ = fVar143 * fStack_1534 + auVar212._12_4_ * fVar165;
            auVar160._20_4_ = fVar167 * (float)local_15c0._4_4_ + fVar163 * auVar7._4_4_;
            auVar160._16_4_ = fVar166 * (float)local_15c0._0_4_ + fVar156 * auVar7._0_4_;
            auVar160._24_4_ = fVar142 * fStack_15b8 + fVar164 * auVar7._8_4_;
            auVar160._28_4_ = fVar143 * fStack_15b4 + fVar165 * auVar7._12_4_;
            auVar168._20_4_ = fVar167 * (float)local_15a0._4_4_ + auVar145._4_4_ * fVar163;
            auVar168._16_4_ = fVar166 * (float)local_15a0._0_4_ + auVar145._0_4_ * fVar156;
            auVar168._24_4_ = fVar142 * fStack_1598 + auVar145._8_4_ * fVar164;
            auVar168._28_4_ = fVar143 * fStack_1594 + auVar145._12_4_ * fVar165;
            auVar173._20_4_ = fVar167 * (float)local_1730._4_4_ + auVar13._4_4_ * fVar163;
            auVar173._16_4_ = fVar166 * (float)local_1730._0_4_ + auVar13._0_4_ * fVar156;
            auVar173._24_4_ = fVar142 * fStack_1728 + auVar13._8_4_ * fVar164;
            auVar173._28_4_ = fVar143 * fStack_1724 + auVar13._12_4_ * fVar165;
            auVar212._0_4_ = auVar199._0_4_ * fVar166 + fVar156 * auVar85._0_4_;
            auVar212._4_4_ = auVar199._4_4_ * fVar167 + fVar163 * auVar85._4_4_;
            auVar212._8_4_ = auVar199._8_4_ * fVar142 + fVar164 * auVar85._8_4_;
            auVar212._12_4_ = auVar199._12_4_ * fVar143 + fVar165 * auVar85._12_4_;
            lVar12 = uVar121 + 0x40 + lVar115;
            local_13a0 = *(undefined8 *)(lVar12 + 0x10);
            uStack_1398 = *(undefined8 *)(lVar12 + 0x18);
            uStack_1390 = local_13a0;
            uStack_1388 = uStack_1398;
            lVar115 = uVar121 + 0x50 + lVar115;
            local_13c0 = *(undefined8 *)(lVar115 + 0x10);
            uStack_13b8 = *(undefined8 *)(lVar115 + 0x18);
            auVar199._0_4_ = fVar166 * (float)local_15b0._0_4_ + fVar156 * auVar158._0_4_;
            auVar199._4_4_ = fVar167 * (float)local_15b0._4_4_ + fVar163 * auVar158._4_4_;
            auVar199._8_4_ = fVar142 * fStack_15a8 + fVar164 * auVar158._8_4_;
            auVar199._12_4_ = fVar143 * fStack_15a4 + fVar165 * auVar158._12_4_;
            auVar132._0_4_ = fVar166 * (float)local_1740._0_4_ + fVar156 * auVar84._0_4_;
            auVar132._4_4_ = fVar167 * (float)local_1740._4_4_ + fVar163 * auVar84._4_4_;
            auVar132._8_4_ = fVar142 * fStack_1738 + fVar164 * auVar84._8_4_;
            auVar132._12_4_ = fVar143 * fStack_1734 + fVar165 * auVar84._12_4_;
            uStack_13b0 = local_13c0;
            uStack_13a8 = uStack_13b8;
            auVar137._16_16_ = auVar176;
            auVar137._0_16_ = auVar176;
            auVar150._16_16_ = auVar146;
            auVar150._0_16_ = auVar146;
            auVar177._16_16_ = auVar210;
            auVar177._0_16_ = auVar210;
            auVar186._16_16_ = auVar212;
            auVar186._0_16_ = auVar212;
            auVar195._16_16_ = auVar199;
            auVar195._0_16_ = auVar199;
            auVar135._16_16_ = auVar132;
            auVar135._0_16_ = auVar132;
            local_16a0 = vsubps_avx(auVar160,auVar137);
            local_15e0 = vsubps_avx(auVar168,auVar150);
            auVar133 = vsubps_avx(auVar173,auVar177);
            auVar147 = vsubps_avx(auVar186,auVar160);
            auVar78 = vsubps_avx(auVar195,auVar168);
            auVar79 = vsubps_avx(auVar135,auVar173);
            fVar165 = auVar79._0_4_;
            fVar198 = local_15e0._0_4_;
            fVar18 = auVar79._4_4_;
            fVar202 = local_15e0._4_4_;
            auVar88._4_4_ = fVar202 * fVar18;
            auVar88._0_4_ = fVar198 * fVar165;
            fVar28 = auVar79._8_4_;
            fVar203 = local_15e0._8_4_;
            auVar88._8_4_ = fVar203 * fVar28;
            fVar38 = auVar79._12_4_;
            fVar204 = local_15e0._12_4_;
            auVar88._12_4_ = fVar204 * fVar38;
            fVar48 = auVar79._16_4_;
            fVar205 = local_15e0._16_4_;
            auVar88._16_4_ = fVar205 * fVar48;
            fVar58 = auVar79._20_4_;
            fVar206 = local_15e0._20_4_;
            auVar88._20_4_ = fVar206 * fVar58;
            fVar68 = auVar79._24_4_;
            fVar207 = local_15e0._24_4_;
            auVar88._24_4_ = fVar207 * fVar68;
            auVar88._28_4_ = auVar132._12_4_;
            fVar166 = auVar78._0_4_;
            fVar175 = auVar133._0_4_;
            fVar19 = auVar78._4_4_;
            fVar180 = auVar133._4_4_;
            auVar89._4_4_ = fVar180 * fVar19;
            auVar89._0_4_ = fVar175 * fVar166;
            fVar29 = auVar78._8_4_;
            fVar181 = auVar133._8_4_;
            auVar89._8_4_ = fVar181 * fVar29;
            fVar39 = auVar78._12_4_;
            fVar182 = auVar133._12_4_;
            auVar89._12_4_ = fVar182 * fVar39;
            fVar49 = auVar78._16_4_;
            fVar183 = auVar133._16_4_;
            auVar89._16_4_ = fVar183 * fVar49;
            fVar59 = auVar78._20_4_;
            fVar184 = auVar133._20_4_;
            auVar89._20_4_ = fVar184 * fVar59;
            fVar69 = auVar78._24_4_;
            fVar185 = auVar133._24_4_;
            auVar89._24_4_ = fVar185 * fVar69;
            auVar89._28_4_ = auVar176._12_4_;
            local_1600 = vsubps_avx(auVar89,auVar88);
            fVar167 = auVar147._0_4_;
            fVar20 = auVar147._4_4_;
            auVar90._4_4_ = fVar180 * fVar20;
            auVar90._0_4_ = fVar175 * fVar167;
            fVar30 = auVar147._8_4_;
            auVar90._8_4_ = fVar181 * fVar30;
            fVar40 = auVar147._12_4_;
            auVar90._12_4_ = fVar182 * fVar40;
            fVar50 = auVar147._16_4_;
            auVar90._16_4_ = fVar183 * fVar50;
            fVar60 = auVar147._20_4_;
            auVar90._20_4_ = fVar184 * fVar60;
            fVar70 = auVar147._24_4_;
            auVar90._24_4_ = fVar185 * fVar70;
            auVar90._28_4_ = auVar176._12_4_;
            fVar142 = local_16a0._0_4_;
            fVar21 = local_16a0._4_4_;
            auVar91._4_4_ = fVar18 * fVar21;
            auVar91._0_4_ = fVar165 * fVar142;
            fVar31 = local_16a0._8_4_;
            auVar91._8_4_ = fVar28 * fVar31;
            fVar41 = local_16a0._12_4_;
            auVar91._12_4_ = fVar38 * fVar41;
            fVar51 = local_16a0._16_4_;
            auVar91._16_4_ = fVar48 * fVar51;
            fVar61 = local_16a0._20_4_;
            auVar91._20_4_ = fVar58 * fVar61;
            fVar71 = local_16a0._24_4_;
            auVar91._24_4_ = fVar68 * fVar71;
            auVar91._28_4_ = auVar146._12_4_;
            auVar133 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar19 * fVar21;
            auVar92._0_4_ = fVar166 * fVar142;
            auVar92._8_4_ = fVar29 * fVar31;
            auVar92._12_4_ = fVar39 * fVar41;
            auVar92._16_4_ = fVar49 * fVar51;
            auVar92._20_4_ = fVar59 * fVar61;
            auVar92._24_4_ = fVar69 * fVar71;
            auVar92._28_4_ = auVar146._12_4_;
            auVar93._4_4_ = fVar202 * fVar20;
            auVar93._0_4_ = fVar198 * fVar167;
            auVar93._8_4_ = fVar203 * fVar30;
            auVar93._12_4_ = fVar204 * fVar40;
            auVar93._16_4_ = fVar205 * fVar50;
            auVar93._20_4_ = fVar206 * fVar60;
            auVar93._24_4_ = fVar207 * fVar70;
            auVar93._28_4_ = local_15e0._28_4_;
            local_16c0 = vsubps_avx(auVar93,auVar92);
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar200._4_4_ = uVar3;
            auVar200._0_4_ = uVar3;
            auVar200._8_4_ = uVar3;
            auVar200._12_4_ = uVar3;
            auVar200._16_4_ = uVar3;
            auVar200._20_4_ = uVar3;
            auVar200._24_4_ = uVar3;
            auVar200._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar208._4_4_ = uVar3;
            auVar208._0_4_ = uVar3;
            auVar208._8_4_ = uVar3;
            auVar208._12_4_ = uVar3;
            auVar208._16_4_ = uVar3;
            auVar208._20_4_ = uVar3;
            auVar208._24_4_ = uVar3;
            auVar208._28_4_ = uVar3;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar211._4_4_ = uVar4;
            auVar211._0_4_ = uVar4;
            auVar211._8_4_ = uVar4;
            auVar211._12_4_ = uVar4;
            auVar211._16_4_ = uVar4;
            auVar211._20_4_ = uVar4;
            auVar211._24_4_ = uVar4;
            auVar211._28_4_ = uVar4;
            fVar156 = (ray->dir).field_0.m128[1];
            local_1620 = vsubps_avx(auVar160,auVar200);
            fVar163 = (ray->dir).field_0.m128[2];
            auVar80 = vsubps_avx(auVar168,auVar208);
            auVar81 = vsubps_avx(auVar173,auVar211);
            fVar143 = auVar81._0_4_;
            fVar22 = auVar81._4_4_;
            auVar94._4_4_ = fVar156 * fVar22;
            auVar94._0_4_ = fVar156 * fVar143;
            fVar32 = auVar81._8_4_;
            auVar94._8_4_ = fVar156 * fVar32;
            fVar42 = auVar81._12_4_;
            auVar94._12_4_ = fVar156 * fVar42;
            fVar52 = auVar81._16_4_;
            auVar94._16_4_ = fVar156 * fVar52;
            fVar62 = auVar81._20_4_;
            auVar94._20_4_ = fVar156 * fVar62;
            fVar72 = auVar81._24_4_;
            auVar94._24_4_ = fVar156 * fVar72;
            auVar94._28_4_ = uVar3;
            fVar162 = auVar80._0_4_;
            fVar23 = auVar80._4_4_;
            auVar95._4_4_ = fVar163 * fVar23;
            auVar95._0_4_ = fVar163 * fVar162;
            fVar33 = auVar80._8_4_;
            auVar95._8_4_ = fVar163 * fVar33;
            fVar43 = auVar80._12_4_;
            auVar95._12_4_ = fVar163 * fVar43;
            fVar53 = auVar80._16_4_;
            auVar95._16_4_ = fVar163 * fVar53;
            fVar63 = auVar80._20_4_;
            auVar95._20_4_ = fVar163 * fVar63;
            fVar73 = auVar80._24_4_;
            auVar95._24_4_ = fVar163 * fVar73;
            auVar95._28_4_ = uVar4;
            auVar80 = vsubps_avx(auVar95,auVar94);
            fVar164 = (ray->dir).field_0.m128[0];
            fVar14 = local_1620._0_4_;
            fVar24 = local_1620._4_4_;
            auVar96._4_4_ = fVar163 * fVar24;
            auVar96._0_4_ = fVar163 * fVar14;
            fVar34 = local_1620._8_4_;
            auVar96._8_4_ = fVar163 * fVar34;
            fVar44 = local_1620._12_4_;
            auVar96._12_4_ = fVar163 * fVar44;
            fVar54 = local_1620._16_4_;
            auVar96._16_4_ = fVar163 * fVar54;
            fVar64 = local_1620._20_4_;
            auVar96._20_4_ = fVar163 * fVar64;
            fVar74 = local_1620._24_4_;
            auVar96._24_4_ = fVar163 * fVar74;
            auVar96._28_4_ = local_1600._28_4_;
            auVar97._4_4_ = fVar164 * fVar22;
            auVar97._0_4_ = fVar164 * fVar143;
            auVar97._8_4_ = fVar164 * fVar32;
            auVar97._12_4_ = fVar164 * fVar42;
            auVar97._16_4_ = fVar164 * fVar52;
            auVar97._20_4_ = fVar164 * fVar62;
            auVar97._24_4_ = fVar164 * fVar72;
            auVar97._28_4_ = auVar176._12_4_;
            auVar81 = vsubps_avx(auVar97,auVar96);
            auVar98._4_4_ = fVar164 * fVar23;
            auVar98._0_4_ = fVar164 * fVar162;
            auVar98._8_4_ = fVar164 * fVar33;
            auVar98._12_4_ = fVar164 * fVar43;
            auVar98._16_4_ = fVar164 * fVar53;
            auVar98._20_4_ = fVar164 * fVar63;
            auVar98._24_4_ = fVar164 * fVar73;
            auVar98._28_4_ = auVar176._12_4_;
            auVar99._4_4_ = fVar156 * fVar24;
            auVar99._0_4_ = fVar156 * fVar14;
            auVar99._8_4_ = fVar156 * fVar34;
            auVar99._12_4_ = fVar156 * fVar44;
            auVar99._16_4_ = fVar156 * fVar54;
            auVar99._20_4_ = fVar156 * fVar64;
            auVar99._24_4_ = fVar156 * fVar74;
            auVar99._28_4_ = local_1620._28_4_;
            auVar82 = vsubps_avx(auVar99,auVar98);
            fVar15 = local_16c0._0_4_;
            fVar25 = local_16c0._4_4_;
            fVar35 = local_16c0._8_4_;
            fVar45 = local_16c0._12_4_;
            fVar55 = local_16c0._16_4_;
            fVar65 = local_16c0._20_4_;
            fVar75 = local_16c0._24_4_;
            fVar16 = auVar133._0_4_;
            fVar26 = auVar133._4_4_;
            fVar36 = auVar133._8_4_;
            fVar46 = auVar133._12_4_;
            fVar56 = auVar133._16_4_;
            fVar66 = auVar133._20_4_;
            fVar76 = auVar133._24_4_;
            auVar155 = ZEXT3264(local_1600);
            fVar17 = local_1600._0_4_;
            fVar27 = local_1600._4_4_;
            fVar37 = local_1600._8_4_;
            fVar47 = local_1600._12_4_;
            fVar57 = local_1600._16_4_;
            fVar67 = local_1600._20_4_;
            fVar77 = local_1600._24_4_;
            auVar151._0_4_ = fVar164 * fVar17 + fVar156 * fVar16 + fVar163 * fVar15;
            auVar151._4_4_ = fVar164 * fVar27 + fVar156 * fVar26 + fVar163 * fVar25;
            auVar151._8_4_ = fVar164 * fVar37 + fVar156 * fVar36 + fVar163 * fVar35;
            auVar151._12_4_ = fVar164 * fVar47 + fVar156 * fVar46 + fVar163 * fVar45;
            auVar151._16_4_ = fVar164 * fVar57 + fVar156 * fVar56 + fVar163 * fVar55;
            auVar151._20_4_ = fVar164 * fVar67 + fVar156 * fVar66 + fVar163 * fVar65;
            auVar151._24_4_ = fVar164 * fVar77 + fVar156 * fVar76 + fVar163 * fVar75;
            auVar151._28_4_ = fVar163 + fVar163 + local_1620._28_4_;
            auVar152 = ZEXT3264(auVar151);
            auVar138._8_4_ = 0x80000000;
            auVar138._0_8_ = 0x8000000080000000;
            auVar138._12_4_ = 0x80000000;
            auVar138._16_4_ = 0x80000000;
            auVar138._20_4_ = 0x80000000;
            auVar138._24_4_ = 0x80000000;
            auVar138._28_4_ = 0x80000000;
            auVar133 = vandps_avx(auVar151,auVar138);
            uVar119 = auVar133._0_4_;
            auVar171._0_4_ =
                 (float)(uVar119 ^
                        (uint)(fVar167 * auVar80._0_4_ +
                              fVar166 * auVar81._0_4_ + fVar165 * auVar82._0_4_));
            uVar188 = auVar133._4_4_;
            auVar171._4_4_ =
                 (float)(uVar188 ^
                        (uint)(fVar20 * auVar80._4_4_ +
                              fVar19 * auVar81._4_4_ + fVar18 * auVar82._4_4_));
            uVar189 = auVar133._8_4_;
            auVar171._8_4_ =
                 (float)(uVar189 ^
                        (uint)(fVar30 * auVar80._8_4_ +
                              fVar29 * auVar81._8_4_ + fVar28 * auVar82._8_4_));
            uVar190 = auVar133._12_4_;
            auVar171._12_4_ =
                 (float)(uVar190 ^
                        (uint)(fVar40 * auVar80._12_4_ +
                              fVar39 * auVar81._12_4_ + fVar38 * auVar82._12_4_));
            uVar191 = auVar133._16_4_;
            auVar171._16_4_ =
                 (float)(uVar191 ^
                        (uint)(fVar50 * auVar80._16_4_ +
                              fVar49 * auVar81._16_4_ + fVar48 * auVar82._16_4_));
            uVar192 = auVar133._20_4_;
            auVar171._20_4_ =
                 (float)(uVar192 ^
                        (uint)(fVar60 * auVar80._20_4_ +
                              fVar59 * auVar81._20_4_ + fVar58 * auVar82._20_4_));
            uVar193 = auVar133._24_4_;
            auVar171._24_4_ =
                 (float)(uVar193 ^
                        (uint)(fVar70 * auVar80._24_4_ +
                              fVar69 * auVar81._24_4_ + fVar68 * auVar82._24_4_));
            uVar194 = auVar133._28_4_;
            auVar171._28_4_ =
                 (float)(uVar194 ^ (uint)(auVar147._28_4_ + auVar78._28_4_ + auVar79._28_4_));
            auVar178._0_4_ =
                 (float)(uVar119 ^
                        (uint)(auVar80._0_4_ * fVar142 +
                              auVar81._0_4_ * fVar198 + fVar175 * auVar82._0_4_));
            auVar178._4_4_ =
                 (float)(uVar188 ^
                        (uint)(auVar80._4_4_ * fVar21 +
                              auVar81._4_4_ * fVar202 + fVar180 * auVar82._4_4_));
            auVar178._8_4_ =
                 (float)(uVar189 ^
                        (uint)(auVar80._8_4_ * fVar31 +
                              auVar81._8_4_ * fVar203 + fVar181 * auVar82._8_4_));
            auVar178._12_4_ =
                 (float)(uVar190 ^
                        (uint)(auVar80._12_4_ * fVar41 +
                              auVar81._12_4_ * fVar204 + fVar182 * auVar82._12_4_));
            auVar178._16_4_ =
                 (float)(uVar191 ^
                        (uint)(auVar80._16_4_ * fVar51 +
                              auVar81._16_4_ * fVar205 + fVar183 * auVar82._16_4_));
            auVar178._20_4_ =
                 (float)(uVar192 ^
                        (uint)(auVar80._20_4_ * fVar61 +
                              auVar81._20_4_ * fVar206 + fVar184 * auVar82._20_4_));
            auVar178._24_4_ =
                 (float)(uVar193 ^
                        (uint)(auVar80._24_4_ * fVar71 +
                              auVar81._24_4_ * fVar207 + fVar185 * auVar82._24_4_));
            auVar178._28_4_ = (float)(uVar194 ^ (uint)(auVar81._28_4_ + auVar82._28_4_ + -0.0));
            auVar147 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar133 = vcmpps_avx(auVar171,auVar147,5);
            auVar147 = vcmpps_avx(auVar178,auVar147,5);
            auVar133 = vandps_avx(auVar133,auVar147);
            auVar139._8_4_ = 0x7fffffff;
            auVar139._0_8_ = 0x7fffffff7fffffff;
            auVar139._12_4_ = 0x7fffffff;
            auVar139._16_4_ = 0x7fffffff;
            auVar139._20_4_ = 0x7fffffff;
            auVar139._24_4_ = 0x7fffffff;
            auVar139._28_4_ = 0x7fffffff;
            local_1320 = vandps_avx(auVar151,auVar139);
            auVar161 = ZEXT3264(local_1320);
            auVar147 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar151,4);
            auVar133 = vandps_avx(auVar133,auVar147);
            auVar140._0_4_ = auVar178._0_4_ + auVar171._0_4_;
            auVar140._4_4_ = auVar178._4_4_ + auVar171._4_4_;
            auVar140._8_4_ = auVar178._8_4_ + auVar171._8_4_;
            auVar140._12_4_ = auVar178._12_4_ + auVar171._12_4_;
            auVar140._16_4_ = auVar178._16_4_ + auVar171._16_4_;
            auVar140._20_4_ = auVar178._20_4_ + auVar171._20_4_;
            auVar140._24_4_ = auVar178._24_4_ + auVar171._24_4_;
            auVar140._28_4_ = auVar178._28_4_ + auVar171._28_4_;
            auVar78 = vcmpps_avx(auVar140,local_1320,2);
            auVar141 = ZEXT3264(auVar78);
            auVar147 = vandps_avx(auVar133,auVar78);
            auVar79 = local_1520 & auVar147;
            if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar79 >> 0x7f,0) != '\0') ||
                  (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar79 >> 0xbf,0) != '\0') ||
                (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar79[0x1f] < '\0') {
              auVar147 = vandps_avx(auVar147,local_1520);
              local_1340._0_4_ =
                   (float)(uVar119 ^ (uint)(fVar17 * fVar14 + fVar16 * fVar162 + fVar143 * fVar15));
              local_1340._4_4_ =
                   (float)(uVar188 ^ (uint)(fVar27 * fVar24 + fVar26 * fVar23 + fVar22 * fVar25));
              local_1340._8_4_ =
                   (float)(uVar189 ^ (uint)(fVar37 * fVar34 + fVar36 * fVar33 + fVar32 * fVar35));
              local_1340._12_4_ =
                   (float)(uVar190 ^ (uint)(fVar47 * fVar44 + fVar46 * fVar43 + fVar42 * fVar45));
              local_1340._16_4_ =
                   (float)(uVar191 ^ (uint)(fVar57 * fVar54 + fVar56 * fVar53 + fVar52 * fVar55));
              local_1340._20_4_ =
                   (float)(uVar192 ^ (uint)(fVar67 * fVar64 + fVar66 * fVar63 + fVar62 * fVar65));
              local_1340._24_4_ =
                   (float)(uVar193 ^ (uint)(fVar77 * fVar74 + fVar76 * fVar73 + fVar72 * fVar75));
              local_1340._28_4_ =
                   uVar194 ^ (uint)(auVar78._28_4_ + auVar78._28_4_ + auVar133._28_4_);
              auVar155 = ZEXT3264(local_1340);
              fVar156 = (ray->org).field_0.m128[3];
              fVar163 = local_1320._0_4_;
              fVar164 = local_1320._4_4_;
              auVar100._4_4_ = fVar164 * fVar156;
              auVar100._0_4_ = fVar163 * fVar156;
              fVar165 = local_1320._8_4_;
              auVar100._8_4_ = fVar165 * fVar156;
              fVar166 = local_1320._12_4_;
              auVar100._12_4_ = fVar166 * fVar156;
              fVar167 = local_1320._16_4_;
              auVar100._16_4_ = fVar167 * fVar156;
              fVar142 = local_1320._20_4_;
              auVar100._20_4_ = fVar142 * fVar156;
              fVar143 = local_1320._24_4_;
              auVar100._24_4_ = fVar143 * fVar156;
              auVar100._28_4_ = fVar156;
              auVar133 = vcmpps_avx(auVar100,local_1340,1);
              fVar156 = ray->tfar;
              auVar101._4_4_ = fVar164 * fVar156;
              auVar101._0_4_ = fVar163 * fVar156;
              auVar101._8_4_ = fVar165 * fVar156;
              auVar101._12_4_ = fVar166 * fVar156;
              auVar101._16_4_ = fVar167 * fVar156;
              auVar101._20_4_ = fVar142 * fVar156;
              auVar101._24_4_ = fVar143 * fVar156;
              auVar101._28_4_ = fVar156;
              auVar78 = vcmpps_avx(local_1340,auVar101,2);
              auVar141 = ZEXT3264(auVar78);
              auVar133 = vandps_avx(auVar78,auVar133);
              auVar78 = auVar147 & auVar133;
              if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar78 >> 0x7f,0) != '\0') ||
                    (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar78 >> 0xbf,0) != '\0') ||
                  (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar78[0x1f] < '\0') {
                local_12e0 = vandps_avx(auVar147,auVar133);
                auVar133 = vsubps_avx(local_1320,auVar178);
                local_1380 = vblendvps_avx(auVar171,auVar133,local_14e0);
                auVar133 = vsubps_avx(local_1320,auVar171);
                local_1360 = vblendvps_avx(auVar178,auVar133,local_14e0);
                auVar152 = ZEXT3264(local_1360);
                uStack_1244 = local_14e0._28_4_;
                local_1260[0] = fVar17 * (float)local_1500._0_4_;
                local_1260[1] = fVar27 * (float)local_1500._4_4_;
                local_1260[2] = fVar37 * fStack_14f8;
                local_1260[3] = fVar47 * fStack_14f4;
                fStack_1250 = fVar57 * fStack_14f0;
                fStack_124c = fVar67 * fStack_14ec;
                fStack_1248 = fVar77 * fStack_14e8;
                local_1240[0] = fVar16 * (float)local_1500._0_4_;
                local_1240[1] = fVar26 * (float)local_1500._4_4_;
                local_1240[2] = fVar36 * fStack_14f8;
                local_1240[3] = fVar46 * fStack_14f4;
                fStack_1230 = fVar56 * fStack_14f0;
                fStack_122c = fVar66 * fStack_14ec;
                fStack_1228 = fVar76 * fStack_14e8;
                uStack_1224 = uStack_1244;
                auVar133 = vrcpps_avx(local_1320);
                local_1220[0] = (float)local_1500._0_4_ * fVar15;
                local_1220[1] = (float)local_1500._4_4_ * fVar25;
                local_1220[2] = fStack_14f8 * fVar35;
                local_1220[3] = fStack_14f4 * fVar45;
                fStack_1210 = fStack_14f0 * fVar55;
                fStack_120c = fStack_14ec * fVar65;
                fStack_1208 = fStack_14e8 * fVar75;
                uStack_1204 = uStack_1244;
                fVar156 = auVar133._0_4_;
                fVar162 = auVar133._4_4_;
                auVar102._4_4_ = fVar164 * fVar162;
                auVar102._0_4_ = fVar163 * fVar156;
                fVar163 = auVar133._8_4_;
                auVar102._8_4_ = fVar165 * fVar163;
                fVar164 = auVar133._12_4_;
                auVar102._12_4_ = fVar166 * fVar164;
                fVar165 = auVar133._16_4_;
                auVar102._16_4_ = fVar167 * fVar165;
                fVar166 = auVar133._20_4_;
                auVar102._20_4_ = fVar142 * fVar166;
                fVar167 = auVar133._24_4_;
                auVar102._24_4_ = fVar143 * fVar167;
                auVar102._28_4_ = local_1320._28_4_;
                auVar169._8_4_ = 0x3f800000;
                auVar169._0_8_ = 0x3f8000003f800000;
                auVar169._12_4_ = 0x3f800000;
                auVar169._16_4_ = 0x3f800000;
                auVar169._20_4_ = 0x3f800000;
                auVar169._24_4_ = 0x3f800000;
                auVar169._28_4_ = 0x3f800000;
                auVar147 = vsubps_avx(auVar169,auVar102);
                fVar156 = fVar156 + fVar156 * auVar147._0_4_;
                fVar162 = fVar162 + fVar162 * auVar147._4_4_;
                fVar163 = fVar163 + fVar163 * auVar147._8_4_;
                fVar164 = fVar164 + fVar164 * auVar147._12_4_;
                fVar165 = fVar165 + fVar165 * auVar147._16_4_;
                fVar166 = fVar166 + fVar166 * auVar147._20_4_;
                fVar167 = fVar167 + fVar167 * auVar147._24_4_;
                auVar161 = ZEXT3264(CONCAT428(auVar133._28_4_ + auVar147._28_4_,
                                              CONCAT424(fVar167,CONCAT420(fVar166,CONCAT416(fVar165,
                                                  CONCAT412(fVar164,CONCAT48(fVar163,CONCAT44(
                                                  fVar162,fVar156))))))));
                local_1280._4_4_ = fVar162 * local_1340._4_4_;
                local_1280._0_4_ = fVar156 * local_1340._0_4_;
                local_1280._8_4_ = fVar163 * local_1340._8_4_;
                local_1280._12_4_ = fVar164 * local_1340._12_4_;
                local_1280._16_4_ = fVar165 * local_1340._16_4_;
                local_1280._20_4_ = fVar166 * local_1340._20_4_;
                local_1280._24_4_ = fVar167 * local_1340._24_4_;
                local_1280._28_4_ = local_1340._28_4_;
                auVar155 = ZEXT3264(local_1280);
                local_12c0[0] = local_1380._0_4_ * fVar156;
                local_12c0[1] = local_1380._4_4_ * fVar162;
                local_12c0[2] = local_1380._8_4_ * fVar163;
                local_12c0[3] = local_1380._12_4_ * fVar164;
                fStack_12b0 = local_1380._16_4_ * fVar165;
                fStack_12ac = local_1380._20_4_ * fVar166;
                fStack_12a8 = local_1380._24_4_ * fVar167;
                uStack_12a4 = local_1380._28_4_;
                local_12a0._4_4_ = local_1360._4_4_ * fVar162;
                local_12a0._0_4_ = local_1360._0_4_ * fVar156;
                local_12a0._8_4_ = local_1360._8_4_ * fVar163;
                local_12a0._12_4_ = local_1360._12_4_ * fVar164;
                local_12a0._16_4_ = local_1360._16_4_ * fVar165;
                local_12a0._20_4_ = local_1360._20_4_ * fVar166;
                local_12a0._24_4_ = local_1360._24_4_ * fVar167;
                local_12a0._28_4_ = local_1380._28_4_;
                auVar141 = ZEXT3264(local_12a0);
                uVar119 = vmovmskps_avx(local_12e0);
                uVar120 = (ulong)uVar119;
                _local_1740 = auVar103;
                _local_1730 = auVar104;
                _local_15c0 = auVar105;
                _local_15b0 = auVar106;
                _local_15a0 = auVar107;
                _local_1590 = auVar108;
                _local_1580 = auVar109;
                _local_1570 = auVar110;
                _local_1560 = auVar111;
                _local_1550 = auVar112;
                _local_1540 = auVar113;
                do {
                  uVar122 = 0;
                  if (uVar120 != 0) {
                    for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                    }
                  }
                  local_1668 = *(uint *)((long)&local_13a0 + uVar122 * 4);
                  pGVar9 = (local_1750->geometries).items[local_1668].ptr;
                  if ((pGVar9->mask & ray->mask) == 0) {
                    uVar120 = uVar120 ^ 1L << (uVar122 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ed14f;
                    local_16a0._0_8_ = context->args;
                    local_15e0._0_8_ = uVar120;
                    local_1650.context = context->user;
                    local_1680 = local_1260[uVar122];
                    auVar131 = ZEXT416((uint)local_1680);
                    local_167c = local_1240[uVar122];
                    auVar132 = ZEXT416((uint)local_167c);
                    local_1678 = local_1220[uVar122];
                    auVar157 = ZEXT416((uint)local_1678);
                    local_1674 = local_12c0[uVar122];
                    local_1670 = *(undefined4 *)(local_12a0 + uVar122 * 4);
                    local_166c = *(undefined4 *)((long)&local_13c0 + uVar122 * 4);
                    local_1664 = (local_1650.context)->instID[0];
                    local_1660 = (local_1650.context)->instPrimID[0];
                    local_16c0._0_4_ = ray->tfar;
                    local_1600._0_8_ = uVar122;
                    ray->tfar = local_1260[uVar122 - 8];
                    local_1754 = -1;
                    local_1650.valid = &local_1754;
                    local_1650.geometryUserPtr = pGVar9->userPtr;
                    local_1650.hit = (RTCHitN *)&local_1680;
                    local_1650.N = 1;
                    local_1620._0_8_ = pGVar9;
                    local_1650.ray = (RTCRayN *)ray;
                    if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002ed03d:
                      if ((*(code **)(local_16a0._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_16a0._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_1620._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002ed14f:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      auVar152 = ZEXT1664(auVar131);
                      auVar155 = ZEXT1664(auVar132);
                      auVar161 = ZEXT1664(auVar157);
                      (**(code **)(local_16a0._0_8_ + 0x10))(&local_1650);
                      auVar141._8_56_ = extraout_var_00;
                      auVar141._0_8_ = extraout_XMM1_Qa_00;
                      if (*local_1650.valid != 0) goto LAB_002ed14f;
                    }
                    else {
                      auVar152 = ZEXT464((uint)local_1680);
                      auVar155 = ZEXT464((uint)local_167c);
                      auVar161 = ZEXT464((uint)local_1678);
                      (*pGVar9->occlusionFilterN)(&local_1650);
                      auVar157 = auVar161._0_16_;
                      auVar132 = auVar155._0_16_;
                      auVar131 = auVar152._0_16_;
                      auVar141._8_56_ = extraout_var;
                      auVar141._0_8_ = extraout_XMM1_Qa;
                      if (*local_1650.valid != 0) goto LAB_002ed03d;
                    }
                    ray->tfar = (float)local_16c0._0_4_;
                    uVar120 = local_15e0._0_8_ ^ 1L << (local_1600._0_8_ & 0x3f);
                  }
                } while (uVar120 != 0);
              }
            }
            local_1748 = local_1748 + 1;
            auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
          } while (local_1748 != local_1708);
        }
        auVar172 = ZEXT3264(local_13e0);
        auVar174 = ZEXT3264(local_1400);
        auVar179 = ZEXT3264(local_1420);
        auVar187 = ZEXT3264(local_1440);
        auVar196 = ZEXT3264(local_1460);
        auVar197 = ZEXT3264(local_1480);
        auVar201 = ZEXT3264(local_14a0);
        auVar209 = ZEXT3264(local_14c0);
        uVar120 = local_1718;
        uVar122 = local_1720;
      } while (local_1710 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }